

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer_Base.cpp
# Opt level: O2

void __thiscall OSTEI_Writer_Base::DeclarePrimPointers(OSTEI_Writer_Base *this)

{
  QAM *am;
  int iVar1;
  OSTEI_HRR_Algorithm_Base *this_00;
  ostream *poVar2;
  _Base_ptr p_Var3;
  QAMSet topq;
  allocator local_f9;
  OSTEI_Writer_Base *local_f8;
  undefined1 local_f0 [48];
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_c0;
  string local_90;
  string local_70;
  string local_50;
  
  local_f8 = this;
  this_00 = OSTEI_HRR_Writer::Algo(this->hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_c0,this_00);
  for (p_Var3 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_c0._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<(local_f8->os_,(string *)&indent4_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"double * restrict ");
    am = (QAM *)(p_Var3 + 1);
    PrimPtrName_abi_cxx11_(&local_50,am);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," = ");
    std::__cxx11::string::string((string *)&local_90,"",&local_f9);
    ArrVarName(&local_70,am,&local_90);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2," + abcd * ");
    QAM::QAM((QAM *)local_f0,am);
    iVar1 = NCART((QAM *)local_f0);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    std::operator<<(poVar2,";\n");
    std::__cxx11::string::~string((string *)(local_f0 + 0x10));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator<<(local_f8->os_,"\n\n");
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_c0);
  return;
}

Assistant:

void OSTEI_Writer_Base::DeclarePrimPointers(void) const
{
    auto topq = hrr_writer_.Algo().TopAM();
    for(const auto & it : topq)
    {
        os_ << indent4 << "double * restrict " << PrimPtrName(it)
            << " = " << ArrVarName(it) << " + abcd * " << NCART(it) << ";\n";
    }

    os_ << "\n\n";
}